

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall Lists<std::shared_ptr<Array>_>::clear(Lists<std::shared_ptr<Array>_> *this)

{
  shared_ptr<ListNodes<std::shared_ptr<Array>_>_> local_30;
  shared_ptr<ListNodes<std::shared_ptr<Array>_>_> local_20;
  Lists<std::shared_ptr<Array>_> *local_10;
  Lists<std::shared_ptr<Array>_> *this_local;
  
  local_10 = this;
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::operator=(&this->theHead,&local_20);
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::~shared_ptr(&local_20);
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::shared_ptr(&local_30,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::operator=(&this->theLast,&local_30);
  std::shared_ptr<ListNodes<std::shared_ptr<Array>_>_>::~shared_ptr(&local_30);
  this->theSize = 0;
  return;
}

Assistant:

void Lists<T>::clear() {
    theHead = nullptr;
    theLast = nullptr;
    theSize = 0;
}